

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

SerializedMessage * __thiscall
miniros::serialization::serializeServiceResponse<roscpp::EmptyResponse_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,bool ok,
          EmptyResponse_<std::allocator<void>_> *message)

{
  uint uVar1;
  element_type *peVar2;
  size_t sVar3;
  uchar *puVar4;
  uint8_t *old_data;
  
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  if ((int)this == 0) {
    __return_storage_ptr__->num_bytes = 1;
    puVar4 = (uchar *)operator_new__(1);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((int)__return_storage_ptr__->num_bytes == 0) {
      throwStreamOverrun();
    }
    *peVar2 = (element_type)this;
  }
  else {
    __return_storage_ptr__->num_bytes = 5;
    puVar4 = (uchar *)operator_new__(5);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (uint)__return_storage_ptr__->num_bytes;
    if (uVar1 == 0) {
      throwStreamOverrun();
    }
    *peVar2 = (element_type)this;
    sVar3 = __return_storage_ptr__->num_bytes;
    if (uVar1 < 5) {
      throwStreamOverrun();
    }
    *(int *)(peVar2 + 1) = (int)sVar3 + -5;
  }
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}